

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O2

ResolveResult * __thiscall
capnp::compiler::BrandedDecl::asResolveResult
          (ResolveResult *__return_storage_ptr__,BrandedDecl *this,uint64_t scopeId,
          Builder brandBuilder)

{
  BrandedDecl *pBVar1;
  ErrorReporter *errorReporter;
  Builder target;
  BrandScope *pBVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ElementCount index;
  ulong uVar6;
  Vector<capnp::compiler::BrandScope_*> levels;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Builder bindings;
  BrandScope *local_140;
  ArrayBuilder<capnp::compiler::BrandScope_*> local_138;
  ulong local_118;
  ulong local_110;
  BrandScope *local_108;
  StructBuilder local_100;
  undefined8 uStack_d8;
  ListBuilder local_d0;
  undefined1 local_a8 [40];
  Builder local_80;
  StructBuilder local_58;
  ulong uVar7;
  
  kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>::
  copyFrom(__return_storage_ptr__,&this->body);
  if (__return_storage_ptr__->tag == 1) {
    *(uint64_t *)((long)&__return_storage_ptr__->field_1 + 0x10) = scopeId;
    local_d0.segment._0_1_ = (this->body).tag == 1;
    if (!(bool)local_d0.segment._0_1_) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                ((Fault *)&local_100,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                 ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
                 (DebugExpression<bool> *)&local_d0);
      kj::_::Debug::Fault::fatal((Fault *)&local_100);
    }
    pBVar2 = (this->brand).ptr;
    local_138.ptr = (BrandScope **)0x0;
    local_138.pos = (BrandScope **)0x0;
    local_138.endPtr = (BrandScope **)0x0;
    local_138.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
    local_108 = pBVar2;
    do {
      local_140 = pBVar2;
      if (((pBVar2->params).size_ != 0) ||
         ((pBVar2->inherited == true && (pBVar2->leafParamCount != 0)))) {
        kj::Vector<capnp::compiler::BrandScope*>::add<capnp::compiler::BrandScope*&>
                  ((Vector<capnp::compiler::BrandScope*> *)&local_138,&local_140);
      }
      pBVar2 = (local_140->parent).ptr.ptr;
    } while (pBVar2 != (BrandScope *)0x0);
    if (local_138.pos != local_138.ptr) {
      capnp::_::StructBuilder::asReader(&brandBuilder._builder);
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x50) = local_100._32_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x58) = uStack_d8;
      *(void **)((long)&__return_storage_ptr__->field_1 + 0x40) = local_100.data;
      *(WirePointer **)((long)&__return_storage_ptr__->field_1 + 0x48) = local_100.pointers;
      *(SegmentBuilder **)((long)&__return_storage_ptr__->field_1 + 0x30) = local_100.segment;
      *(CapTableBuilder **)((long)&__return_storage_ptr__->field_1 + 0x38) = local_100.capTable;
      (__return_storage_ptr__->field_1).space[0x28] = '\x01';
      local_a8._0_8_ = brandBuilder._builder.segment;
      local_a8._8_8_ = brandBuilder._builder.capTable;
      local_a8._16_8_ = brandBuilder._builder.data;
      local_a8._24_8_ = brandBuilder._builder.pointers;
      local_a8._32_4_ = brandBuilder._builder.dataSize;
      local_a8._36_2_ = brandBuilder._builder.pointerCount;
      local_a8._38_2_ = brandBuilder._builder._38_2_;
      capnp::schema::Brand::Builder::initScopes
                ((Builder *)&local_d0,(Builder *)local_a8,
                 (uint)((ulong)((long)local_138.pos - (long)local_138.ptr) >> 3));
      uVar4 = (long)local_138.pos - (long)local_138.ptr >> 3;
      uVar6 = 0;
      local_118 = uVar4;
      while( true ) {
        if (uVar6 == uVar4) break;
        capnp::_::ListBuilder::getStructElement(&local_100,&local_d0,(ElementCount)uVar6);
        pBVar2 = local_138.ptr[uVar6 & 0xffffffff];
        *(uint64_t *)local_100.data = pBVar2->leafId;
        if (pBVar2->inherited == true) {
          *(undefined2 *)((long)local_100.data + 8) = 1;
          uVar7 = uVar6;
        }
        else {
          local_110 = uVar6;
          capnp::schema::Brand::Scope::Builder::initBind
                    ((Builder *)local_a8,(Builder *)&local_100,(uint)(pBVar2->params).size_);
          uVar3 = local_a8._24_8_ & 0xffffffff;
          index = 0;
          for (lVar5 = 0; uVar4 = local_118, uVar7 = local_110, uVar3 * 0xa8 - lVar5 != 0;
              lVar5 = lVar5 + 0xa8) {
            pBVar1 = (local_138.ptr[uVar6 & 0xffffffff]->params).ptr;
            errorReporter = local_108->errorReporter;
            capnp::_::ListBuilder::getStructElement(&local_58,(ListBuilder *)local_a8,index);
            capnp::schema::Brand::Binding::Builder::initType(&local_80,(Builder *)&local_58);
            target._builder.capTable = local_80._builder.capTable;
            target._builder.segment = local_80._builder.segment;
            target._builder.data = local_80._builder.data;
            target._builder.pointers = local_80._builder.pointers;
            target._builder.dataSize = local_80._builder.dataSize;
            target._builder.pointerCount = local_80._builder.pointerCount;
            target._builder._38_2_ = local_80._builder._38_2_;
            compileAsType((BrandedDecl *)((long)&(pBVar1->body).tag + lVar5),errorReporter,target);
            index = index + 1;
          }
        }
        uVar6 = uVar7 + 1;
      }
    }
    kj::ArrayBuilder<capnp::compiler::BrandScope_*>::dispose(&local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

Resolver::ResolveResult BrandedDecl::asResolveResult(
    uint64_t scopeId, schema::Brand::Builder brandBuilder) {
  auto result = body;
  if (result.is<Resolver::ResolvedDecl>()) {
    // May need to compile our context as the "brand".

    result.get<Resolver::ResolvedDecl>().scopeId = scopeId;

    getIdAndFillBrand([&]() {
      result.get<Resolver::ResolvedDecl>().brand = brandBuilder.asReader();
      return brandBuilder;
    });
  }
  return result;
}